

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_commands.cpp
# Opt level: O0

void set_command_from_button(Am_Object *parent_command,Am_Object *button)

{
  bool bVar1;
  Am_Value *in_value;
  undefined1 local_28 [8];
  Am_Value value;
  Am_Object *button_local;
  Am_Object *parent_command_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)button;
  Am_Value::Am_Value((Am_Value *)local_28,0);
  bVar1 = Am_Object::Valid(button);
  if (bVar1) {
    in_value = Am_Object::Peek(button,0x1af,0);
    Am_Value::operator=((Am_Value *)local_28,in_value);
  }
  Am_Object::Set(parent_command,0x169,(Am_Value *)local_28,0);
  Am_Value::~Am_Value((Am_Value *)local_28);
  return;
}

Assistant:

void
set_command_from_button(Am_Object parent_command, Am_Object button)
{
  Am_Value value = 0;
  if (button.Valid())
    value = button.Peek(Am_LABEL_OR_ID);
  parent_command.Set(Am_VALUE, value);
}